

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool ON_Font::IsNotAppleFontName(wchar_t *font_description)

{
  bool bVar1;
  
  if ((font_description != (wchar_t *)0x0) && (*font_description != L'\0')) {
    bVar1 = ON_wString::EqualOrdinal(L"Default",font_description,true);
    return bVar1;
  }
  return true;
}

Assistant:

bool ON_Font::IsNotAppleFontName(
  const wchar_t* font_description
  )
{
  if (nullptr == font_description || 0 == font_description[0])
    return true;
  if ( ON_wString::EqualOrdinal(L"Default",font_description,true) )
    return true;
  // In RH-35535 Marlin reports that Arial is shipped with OS X.
  //if ( ON_wString::EqualOrdinal(L"Arial",font_description,true) )
  //  return true;
  return false;
}